

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_face_load_sbit_image
                   (TT_Face face,FT_ULong strike_index,FT_UInt glyph_index,FT_UInt load_flags,
                   FT_Stream stream,FT_Bitmap *map,TT_SBit_MetricsRec *metrics)

{
  FT_UInt *pFVar1;
  FT_Stream stream_00;
  FT_Library library;
  long lVar2;
  FT_UInt16 FVar3;
  int iVar4;
  FT_UInt32 FVar5;
  FT_UInt32 FVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  TT_SBitDecoderRec decoder [1];
  TT_SBitDecoderRec_ local_88;
  
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    if (face->ebdt_size == 0) {
      iVar4 = 0x8e;
    }
    else {
      stream_00 = (face->root).stream;
      uVar8 = face->sbit_strike_map[strike_index];
      iVar4 = FT_Stream_Seek(stream_00,face->ebdt_start);
      if (iVar4 == 0) {
        local_88.bitmap = &((face->root).glyph)->bitmap;
        local_88.metrics = metrics;
        local_88.metrics_loaded = '\0';
        local_88.bitmap_allocated = '\0';
        local_88.ebdt_start = face->ebdt_start;
        local_88.ebdt_size = face->ebdt_size;
        local_88.eblc_base = face->sbit_table;
        uVar7 = face->sbit_table_size;
        local_88.eblc_limit = local_88.eblc_base + uVar7;
        iVar4 = 3;
        local_88.face = face;
        local_88.stream = stream_00;
        if ((ulong)uVar8 * 0x30 + 0x37 <= uVar7) {
          lVar2 = (ulong)uVar8 * 0x30;
          uVar8 = *(uint *)(local_88.eblc_base + lVar2 + 8);
          local_88.strike_index_array =
               (FT_ULong)
               (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
          uVar8 = *(uint *)(local_88.eblc_base + lVar2 + 0x10);
          local_88.strike_index_count =
               (FT_ULong)
               (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
          local_88.bit_depth = local_88.eblc_base[lVar2 + 0x36];
          if ((uVar7 < local_88.strike_index_array) ||
             (iVar4 = 0, uVar7 - local_88.strike_index_array >> 3 < local_88.strike_index_count)) {
            iVar4 = 3;
          }
        }
      }
    }
    if (iVar4 == 0) {
      iVar4 = tt_sbit_decoder_load_image(&local_88,glyph_index,0,0,0,(byte)(load_flags >> 0x16) & 1)
      ;
    }
  }
  else {
    iVar4 = 2;
    if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
      uVar8 = face->sbit_strike_map[strike_index];
      metrics->height = 0;
      metrics->width = 0;
      if (glyph_index <= (uint)(face->root).num_glyphs) {
        uVar8 = *(uint *)(face->sbit_table + (ulong)uVar8 * 4 + 8);
        uVar7 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18);
        iVar9 = 5;
        do {
          iVar10 = 3;
          iVar4 = iVar10;
          if ((((face->ebdt_size <= uVar7) ||
               (face->ebdt_size - uVar7 < (ulong)(glyph_index * 4 + 0xc))) ||
              (iVar4 = FT_Stream_Seek(stream,(ulong)(glyph_index << 2) + uVar7 + 4 +
                                             face->ebdt_start), iVar4 != 0)) ||
             (iVar4 = FT_Stream_EnterFrame(stream,8), iVar4 != 0)) goto LAB_00249373;
          FVar5 = FT_Stream_GetULong(stream);
          FVar6 = FT_Stream_GetULong(stream);
          FT_Stream_ExitFrame(stream);
          uVar8 = FVar6 - FVar5;
          if (uVar8 == 0) {
            iVar4 = 0x9d;
            goto LAB_00249373;
          }
          iVar4 = iVar10;
          if (((FVar6 < FVar5) || (uVar8 < 8)) ||
             ((face->ebdt_size - uVar7 < (ulong)FVar6 ||
              ((iVar4 = FT_Stream_Seek(stream,FVar5 + uVar7 + face->ebdt_start), iVar4 != 0 ||
               (iVar4 = FT_Stream_EnterFrame(stream,(ulong)uVar8), iVar4 != 0))))))
          goto LAB_00249373;
          FT_Stream_GetUShort(stream);
          FT_Stream_GetUShort(stream);
          FVar5 = FT_Stream_GetULong(stream);
          if (FVar5 != 0x64757065) {
            if (((FVar5 == 0x6a706720) || (FVar5 == 0x7267626c)) || (iVar4 = 7, FVar5 == 0x74696666)
               ) {
              iVar4 = 2;
            }
LAB_002495d6:
            FT_Stream_ExitFrame(stream);
            goto LAB_00249373;
          }
          iVar9 = iVar9 + -1;
          if (iVar9 == 0) {
            iVar4 = 3;
            goto LAB_002495d6;
          }
          FVar3 = FT_Stream_GetUShort(stream);
          glyph_index = (FT_UInt)FVar3;
          FT_Stream_ExitFrame(stream);
        } while (glyph_index <= (uint)(face->root).num_glyphs);
      }
      iVar4 = 6;
    }
  }
LAB_00249373:
  if (((iVar4 == 0) && (iVar4 = 0, (load_flags & 0x500000) == 0)) && (map->pixel_mode == '\a')) {
    library = ((face->root).glyph)->library;
    FT_Bitmap_Init((FT_Bitmap *)&local_88);
    iVar4 = FT_Bitmap_Convert(library,map,(FT_Bitmap *)&local_88,1);
    if (iVar4 == 0) {
      map->pixel_mode = local_88.metrics._2_1_;
      map->pitch = (int)local_88.stream;
      map->num_grays = (unsigned_short)local_88.metrics;
      ft_glyphslot_set_bitmap((face->root).glyph,(FT_Byte *)local_88.bitmap);
      pFVar1 = &((face->root).glyph)->internal->flags;
      *pFVar1 = *pFVar1 | 1;
    }
    else {
      FT_Bitmap_Done(library,(FT_Bitmap *)&local_88);
    }
  }
  return iVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit_image( TT_Face              face,
                           FT_ULong             strike_index,
                           FT_UInt              glyph_index,
                           FT_UInt              load_flags,
                           FT_Stream            stream,
                           FT_Bitmap           *map,
                           TT_SBit_MetricsRec  *metrics )
  {
    FT_Error  error = FT_Err_Ok;


    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        TT_SBitDecoderRec  decoder[1];


        error = tt_sbit_decoder_init( decoder, face, strike_index, metrics );
        if ( !error )
        {
          error = tt_sbit_decoder_load_image(
                    decoder,
                    glyph_index,
                    0,
                    0,
                    0,
                    ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
          tt_sbit_decoder_done( decoder );
        }
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      error = tt_face_load_sbix_image(
                face,
                strike_index,
                glyph_index,
                stream,
                map,
                metrics,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      break;

    default:
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    /* Flatten color bitmaps if color was not requested. */
    if ( !error                                        &&
         !( load_flags & FT_LOAD_COLOR )               &&
         !( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) &&
         map->pixel_mode == FT_PIXEL_MODE_BGRA         )
    {
      FT_Bitmap   new_map;
      FT_Library  library = face->root.glyph->library;


      FT_Bitmap_Init( &new_map );

      /* Convert to 8bit grayscale. */
      error = FT_Bitmap_Convert( library, map, &new_map, 1 );
      if ( error )
        FT_Bitmap_Done( library, &new_map );
      else
      {
        map->pixel_mode = new_map.pixel_mode;
        map->pitch      = new_map.pitch;
        map->num_grays  = new_map.num_grays;

        ft_glyphslot_set_bitmap( face->root.glyph, new_map.buffer );
        face->root.glyph->internal->flags |= FT_GLYPH_OWN_BITMAP;
      }
    }

    return error;
  }